

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  char *pcVar1;
  void *pvVar2;
  ostream *poVar3;
  StreamingListener *this_00;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar1 = FLAGS_gtest_stream_result_to_abi_cxx11_;
  if (DAT_0016b310 != 0) {
    pvVar2 = memchr(FLAGS_gtest_stream_result_to_abi_cxx11_,0x3a,DAT_0016b310);
    __n = (long)pvVar2 - (long)pcVar1;
    if (__n == 0xffffffffffffffff || pvVar2 == (void *)0x0) {
      GTestLog::GTestLog((GTestLog *)&local_68,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest.cc"
                         ,0x1614);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unrecognized streaming target \"",0x1f);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,FLAGS_gtest_stream_result_to_abi_cxx11_,DAT_0016b310
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ignored.",10);
      GTestLog::~GTestLog((GTestLog *)&local_68);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FLAGS_gtest_stream_result_to_abi_cxx11_,0,__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FLAGS_gtest_stream_result_to_abi_cxx11_,__n + 1,0xffffffffffffffff);
      StreamingListener::StreamingListener(this_00,&local_68,&local_48);
      TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

SingleFailureChecker::SingleFailureChecker(const TestPartResultArray* results,
                                           TestPartResult::Type type,
                                           const std::string& substr)
    : results_(results), type_(type), substr_(substr) {}